

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int luaO_str2d(char *s,lua_Number *result)

{
  ulong uVar1;
  ushort **ppuVar2;
  double dVar3;
  undefined1 auVar4 [16];
  lua_Number *local_28;
  char *endptr;
  lua_Number *result_local;
  char *s_local;
  
  endptr = (char *)result;
  result_local = (lua_Number *)s;
  dVar3 = strtod(s,(char **)&local_28);
  *(double *)endptr = dVar3;
  if (local_28 == result_local) {
    s_local._4_4_ = 0;
  }
  else {
    if ((*(byte *)local_28 == 0x78) || (*(byte *)local_28 == 0x58)) {
      uVar1 = strtoul((char *)result_local,(char **)&local_28,0x10);
      auVar4._8_4_ = (int)(uVar1 >> 0x20);
      auVar4._0_8_ = uVar1;
      auVar4._12_4_ = 0x45300000;
      *(double *)endptr =
           (auVar4._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    }
    if (*(byte *)local_28 == 0) {
      s_local._4_4_ = 1;
    }
    else {
      while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(uint)*(byte *)local_28] & 0x2000) != 0) {
        local_28 = (lua_Number *)((long)local_28 + 1);
      }
      if (*(byte *)local_28 == 0) {
        s_local._4_4_ = 1;
      }
      else {
        s_local._4_4_ = 0;
      }
    }
  }
  return s_local._4_4_;
}

Assistant:

static int luaO_str2d(const char*s,lua_Number*result){
char*endptr;
*result=lua_str2number(s,&endptr);
if(endptr==s)return 0;
if(*endptr=='x'||*endptr=='X')
*result=cast_num(strtoul(s,&endptr,16));
if(*endptr=='\0')return 1;
while(isspace(cast(unsigned char,*endptr)))endptr++;
if(*endptr!='\0')return 0;
return 1;
}